

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O3

GLuint SDL_GL_LoadTexture(SDL_Surface *surface,GLfloat *texcoord)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Uint8 UVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  GLuint GVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  GLuint texture;
  undefined4 local_38;
  undefined4 local_34;
  
  iVar7 = 1;
  do {
    iVar9 = iVar7;
    iVar7 = iVar9 * 2;
  } while (iVar9 < surface->w);
  iVar7 = 1;
  do {
    iVar10 = iVar7;
    iVar7 = iVar10 * 2;
  } while (iVar10 < surface->h);
  auVar14._0_4_ = (float)surface->w;
  auVar14._4_4_ = (float)surface->h;
  auVar14._8_8_ = 0;
  auVar15._0_4_ = (float)iVar9;
  auVar15._4_4_ = (float)iVar10;
  auVar15._8_8_ = 0;
  auVar14 = divps(auVar14,auVar15);
  texcoord[0] = 0.0;
  texcoord[1] = 0.0;
  *(long *)(texcoord + 2) = auVar14._0_8_;
  lVar8 = SDL_CreateRGBSurface(0,iVar9,iVar10,0x20,0xff,0xff00,0xff0000,0xffffffffff000000);
  GVar11 = 0;
  if (lVar8 != 0) {
    uVar6 = surface->flags;
    if ((uVar6 >> 0x10 & 1) == 0) {
      local_38 = 0;
      uVar1 = surface->w;
      uVar3 = surface->h;
      auVar12._4_4_ = uVar3;
      auVar12._0_4_ = uVar1;
      auVar12._8_8_ = 0;
      auVar14 = pshuflw(auVar12,auVar12,0xe8);
      local_34 = auVar14._0_4_;
      SDL_UpperBlit(surface,&local_38,lVar8);
    }
    else {
      UVar5 = surface->format->alpha;
      SDL_SetAlpha(surface,0,0);
      local_38 = 0;
      uVar2 = surface->w;
      uVar4 = surface->h;
      auVar13._4_4_ = uVar4;
      auVar13._0_4_ = uVar2;
      auVar13._8_8_ = 0;
      auVar14 = pshuflw(auVar13,auVar13,0xe8);
      local_34 = auVar14._0_4_;
      SDL_UpperBlit(surface,&local_38,lVar8);
      SDL_SetAlpha(surface,uVar6 & 0x12000,UVar5);
    }
    glGenTextures(1,&texture);
    glBindTexture(0xde1,texture);
    glTexParameteri(0xde1,0x2800,0x2600);
    glTexParameteri(0xde1,0x2801,0x2600);
    glTexImage2D(0xde1,0,0x1908,iVar9,iVar10,0,0x1908,0x1401,*(undefined8 *)(lVar8 + 0x20));
    SDL_FreeSurface(lVar8);
    GVar11 = texture;
  }
  return GVar11;
}

Assistant:

GLuint SDL_GL_LoadTexture(SDL_Surface *surface, GLfloat *texcoord)
{
	GLuint texture;
	int w, h;
	SDL_Surface *image;
	SDL_Rect area;
	Uint32 saved_flags;
	Uint8  saved_alpha;

	/* Use the surface width and height expanded to powers of 2 */
	w = power_of_two(surface->w);
	h = power_of_two(surface->h);
	texcoord[0] = 0.0f;			/* Min X */
	texcoord[1] = 0.0f;			/* Min Y */
	texcoord[2] = (GLfloat)surface->w / w;	/* Max X */
	texcoord[3] = (GLfloat)surface->h / h;	/* Max Y */

	image = SDL_CreateRGBSurface(
			SDL_SWSURFACE,
			w, h,
			32,
#if SDL_BYTEORDER == SDL_LIL_ENDIAN /* OpenGL RGBA masks */
			0x000000FF, 
			0x0000FF00, 
			0x00FF0000, 
			0xFF000000
#else
			0xFF000000,
			0x00FF0000, 
			0x0000FF00, 
			0x000000FF
#endif
		       );
	if ( image == NULL ) {
		return 0;
	}

	/* Save the alpha blending attributes */
	saved_flags = surface->flags&(SDL_SRCALPHA|SDL_RLEACCELOK);
	saved_alpha = surface->format->alpha;
	if ( (saved_flags & SDL_SRCALPHA) == SDL_SRCALPHA ) {
		SDL_SetAlpha(surface, 0, 0);
	}

	/* Copy the surface into the GL texture image */
	area.x = 0;
	area.y = 0;
	area.w = surface->w;
	area.h = surface->h;
	SDL_BlitSurface(surface, &area, image, &area);

	/* Restore the alpha blending attributes */
	if ( (saved_flags & SDL_SRCALPHA) == SDL_SRCALPHA ) {
		SDL_SetAlpha(surface, saved_flags, saved_alpha);
	}

	/* Create an OpenGL texture for the image */
	glGenTextures(1, &texture);
	glBindTexture(GL_TEXTURE_2D, texture);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexImage2D(GL_TEXTURE_2D,
		     0,
		     GL_RGBA,
		     w, h,
		     0,
		     GL_RGBA,
		     GL_UNSIGNED_BYTE,
		     image->pixels);
	SDL_FreeSurface(image); /* No longer needed */

	return texture;
}